

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.h
# Opt level: O2

void __thiscall Js::AsmJsFunctionInfo::AsmJsFunctionInfo(AsmJsFunctionInfo *this)

{
  (this->mArgType).ptr = (Which *)0x0;
  this->mArgSizesLength = 0;
  (this->mArgSizes).ptr = (uint *)0x0;
  this->mArgByteSize = 0;
  this->mTypedSlotInfos[0].constCount = 0;
  this->mTypedSlotInfos[0].varCount = 0;
  this->mTypedSlotInfos[0].tmpCount = 0;
  this->mTypedSlotInfos[0].byteOffset = 0;
  *(undefined8 *)&this->mTypedSlotInfos[0].constSrcByteOffset = 0;
  this->mTypedSlotInfos[1].varCount = 0;
  this->mTypedSlotInfos[1].tmpCount = 0;
  this->mTypedSlotInfos[1].byteOffset = 0;
  this->mTypedSlotInfos[1].constSrcByteOffset = 0;
  this->mTypedSlotInfos[2].constCount = 0;
  this->mTypedSlotInfos[2].varCount = 0;
  this->mTypedSlotInfos[2].tmpCount = 0;
  this->mTypedSlotInfos[2].byteOffset = 0;
  *(undefined8 *)&this->mTypedSlotInfos[2].constSrcByteOffset = 0;
  this->mTypedSlotInfos[3].varCount = 0;
  this->mTypedSlotInfos[3].tmpCount = 0;
  this->mTypedSlotInfos[3].byteOffset = 0;
  this->mTypedSlotInfos[3].constSrcByteOffset = 0;
  this->mTypedSlotInfos[4].constCount = 0;
  this->mTypedSlotInfos[4].varCount = 0;
  this->mTypedSlotInfos[4].tmpCount = 0;
  this->mTypedSlotInfos[4].byteOffset = 0;
  *(undefined8 *)((long)&this->mTypedSlotInfos[4].byteOffset + 2) = 0;
  AsmJsRetType::AsmJsRetType(&this->mReturnType,Void);
  *(undefined8 *)((long)&(this->mWasmReaderInfo).ptr + 1) = 0;
  *(undefined8 *)((long)&(this->mWasmModule).ptr + 1) = 0;
  (this->mSignature).ptr = (WasmSignature *)0x0;
  (this->mWasmReaderInfo).ptr = (WasmReaderInfo *)0x0;
  (this->asmJsModuleFunctionBody).ptr = (FunctionBody *)0x0;
  (this->mLazyError).ptr = (JavascriptError *)0x0;
  this->mTotalSizeBytes = 0;
  (this->mbyteCodeTJMap).ptr =
       (BaseDictionary<int,_long,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *)0x0;
  (this->mTJBeginAddress).ptr = (uchar *)0x0;
  return;
}

Assistant:

AsmJsFunctionInfo() : mArgCount(0),
                              mArgSizesLength(0),
                              mReturnType(AsmJsRetType::Void),
                              mArgByteSize(0),
                              asmJsModuleFunctionBody(nullptr),
                              mTJBeginAddress(nullptr),
#ifdef ENABLE_WASM
                              mWasmReaderInfo(nullptr),
                              mSignature(nullptr),
                              mWasmModule(nullptr),
#endif
                              mUsesHeapBuffer(false),
                              mArgType(nullptr),
                              mArgSizes(nullptr) {}